

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.c
# Opt level: O3

int rtosc_arg_vals_eq(rtosc_arg_val_t *lhs,rtosc_arg_val_t *rhs,size_t lsize,size_t rsize,
                     rtosc_cmp_options *opt)

{
  int iVar1;
  int iVar2;
  rtosc_arg_val_t *_lhs;
  rtosc_arg_val_t *_rhs;
  rtosc_cmp_options *opt_00;
  rtosc_arg_val_itr ritr;
  rtosc_arg_val_itr litr;
  rtosc_arg_val_t rrhs;
  rtosc_arg_val_t rlhs;
  rtosc_arg_val_itr local_90;
  rtosc_arg_val_itr local_78;
  rtosc_arg_val_t local_60;
  rtosc_arg_val_t local_48;
  
  rtosc_arg_val_itr_init(&local_78,lhs);
  rtosc_arg_val_itr_init(&local_90,rhs);
  opt_00 = &default_cmp_options;
  if (opt != (rtosc_cmp_options *)0x0) {
    opt_00 = opt;
  }
  iVar1 = rtosc_arg_vals_cmp_has_next(&local_78,&local_90,lsize,rsize);
  if (iVar1 != 0) {
    do {
      _lhs = rtosc_arg_val_itr_get(&local_78,&local_48);
      _rhs = rtosc_arg_val_itr_get(&local_90,&local_60);
      iVar1 = rtosc_arg_vals_eq_single(_lhs,_rhs,opt_00);
      rtosc_arg_val_itr_next(&local_78);
      rtosc_arg_val_itr_next(&local_90);
      iVar2 = rtosc_arg_vals_cmp_has_next(&local_78,&local_90,lsize,rsize);
      if (iVar2 == 0) break;
    } while (iVar1 != 0);
    if (iVar1 == 0) {
      return 0;
    }
  }
  iVar1 = rtosc_arg_vals_eq_after_abort(&local_78,&local_90,lsize,rsize);
  return iVar1;
}

Assistant:

int rtosc_arg_vals_eq(const rtosc_arg_val_t* lhs, const rtosc_arg_val_t* rhs,
                      size_t lsize, size_t rsize,
                      const rtosc_cmp_options* opt)
{
    // used if the value of lhs or rhs is range-computed:
    rtosc_arg_val_t rlhs, rrhs;

    rtosc_arg_val_itr litr, ritr;
    rtosc_arg_val_itr_init(&litr, lhs);
    rtosc_arg_val_itr_init(&ritr, rhs);

    int rval = 1;

    if(!opt)
        opt = &default_cmp_options;

    for( ; rtosc_arg_vals_cmp_has_next(&litr, &ritr, lsize, rsize) && rval;
        rtosc_arg_val_itr_next(&litr),
        rtosc_arg_val_itr_next(&ritr))
    {
        rval = rtosc_arg_vals_eq_single(rtosc_arg_val_itr_get(&litr, &rlhs),
                                        rtosc_arg_val_itr_get(&ritr, &rrhs),
                                        opt);
    }

    return rval
        ? rtosc_arg_vals_eq_after_abort(&litr, &ritr, lsize, rsize)
        : rval;
}